

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_WriteFileHeader(Super_Man_t *pMan,FILE *pFile)

{
  char *pcVar1;
  char *pcVar2;
  FILE *pFile_local;
  Super_Man_t *pMan_local;
  
  fprintf((FILE *)pFile,"#\n");
  pcVar2 = pMan->pName;
  pcVar1 = Extra_TimeStamp();
  fprintf((FILE *)pFile,"# Supergate library derived for \"%s\" on %s.\n",pcVar2,pcVar1);
  fprintf((FILE *)pFile,"#\n");
  pcVar2 = "-s";
  if (pMan->fSkipInv != 0) {
    pcVar2 = "";
  }
  fprintf((FILE *)pFile,"# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n"
          ,(double)pMan->tDelayMax,(double)pMan->tAreaMax,(ulong)(uint)pMan->nVarsMax,
          (ulong)(uint)pMan->nLevels,(ulong)(uint)pMan->nGatesMax,(ulong)(uint)pMan->TimeLimit,
          pcVar2,pMan->pName);
  fprintf((FILE *)pFile,"#\n");
  fprintf((FILE *)pFile,"# The number of inputs      = %10d.\n",(ulong)(uint)pMan->nVarsMax);
  fprintf((FILE *)pFile,"# The number of levels      = %10d.\n",(ulong)(uint)pMan->nLevels);
  fprintf((FILE *)pFile,"# The maximum delay         = %10.2f.\n",(double)pMan->tDelayMax);
  fprintf((FILE *)pFile,"# The maximum area          = %10.2f.\n",(double)pMan->tAreaMax);
  fprintf((FILE *)pFile,"# The maximum runtime (sec) = %10d.\n",(ulong)(uint)pMan->TimeLimit);
  fprintf((FILE *)pFile,"#\n");
  fprintf((FILE *)pFile,"# The number of attempts    = %10d.\n",(ulong)(uint)pMan->nTried);
  fprintf((FILE *)pFile,"# The number of supergates  = %10d.\n",(ulong)(uint)pMan->nGates);
  fprintf((FILE *)pFile,"# The number of functions   = %10d.\n",(ulong)(uint)pMan->nUnique);
  pow(2.0,(double)pMan->nMints);
  fprintf((FILE *)pFile,"# The total functions       = %.0f (2^%d).\n",(ulong)(uint)pMan->nMints);
  fprintf((FILE *)pFile,"#\n");
  fprintf((FILE *)pFile,"# Generation time           = %10.2f sec.\n",
          (double)((float)pMan->Time / 1e+06));
  fprintf((FILE *)pFile,"#\n");
  fprintf((FILE *)pFile,"%s\n",pMan->pName);
  fprintf((FILE *)pFile,"%d\n",(ulong)(uint)pMan->nVarsMax);
  fprintf((FILE *)pFile,"%d\n",(ulong)(uint)pMan->nGates);
  return;
}

Assistant:

void Super_WriteFileHeader( Super_Man_t * pMan, FILE * pFile )
{
    fprintf( pFile, "#\n" );
    fprintf( pFile, "# Supergate library derived for \"%s\" on %s.\n", pMan->pName, Extra_TimeStamp() );
    fprintf( pFile, "#\n" );
    fprintf( pFile, "# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n", 
        pMan->nVarsMax, pMan->nLevels, pMan->nGatesMax, pMan->TimeLimit, pMan->tDelayMax, pMan->tAreaMax, (pMan->fSkipInv? "" : "-s"), pMan->pName );
    fprintf( pFile, "#\n" );
    fprintf( pFile, "# The number of inputs      = %10d.\n", pMan->nVarsMax );
    fprintf( pFile, "# The number of levels      = %10d.\n", pMan->nLevels );
    fprintf( pFile, "# The maximum delay         = %10.2f.\n", pMan->tDelayMax  );
    fprintf( pFile, "# The maximum area          = %10.2f.\n", pMan->tAreaMax );
    fprintf( pFile, "# The maximum runtime (sec) = %10d.\n", pMan->TimeLimit );
    fprintf( pFile, "#\n" );
    fprintf( pFile, "# The number of attempts    = %10d.\n", pMan->nTried  );
    fprintf( pFile, "# The number of supergates  = %10d.\n", pMan->nGates  );
    fprintf( pFile, "# The number of functions   = %10d.\n", pMan->nUnique );
    fprintf( pFile, "# The total functions       = %.0f (2^%d).\n", pow((double)2,pMan->nMints), pMan->nMints );
    fprintf( pFile, "#\n" );
    fprintf( pFile, "# Generation time           = %10.2f sec.\n", (float)(pMan->Time)/(float)(CLOCKS_PER_SEC) );
    fprintf( pFile, "#\n" );
    fprintf( pFile, "%s\n", pMan->pName );
    fprintf( pFile, "%d\n", pMan->nVarsMax );
    fprintf( pFile, "%d\n", pMan->nGates );
}